

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O2

void __thiscall
despot::option::Parser::StoreOptionAction::StoreOptionAction
          (StoreOptionAction *this,Parser *parser_,Option *options_,Option *buffer_,int bufmax_)

{
  ulong uVar1;
  Descriptor **ppDVar2;
  
  (this->super_Action)._vptr_Action = (_func_int **)&PTR__Action_0019bf70;
  this->parser = parser_;
  this->options = options_;
  this->buffer = buffer_;
  this->bufmax = bufmax_;
  uVar1 = 0;
  for (ppDVar2 = &buffer_->desc;
      ((uVar1 < (uint)bufmax_ || bufmax_ < 0 && (buffer_ != (Option *)0x0)) &&
      (*ppDVar2 != (Descriptor *)0x0)); ppDVar2 = ppDVar2 + 6) {
    uVar1 = uVar1 + 1;
  }
  parser_->op_count = (int)uVar1;
  return;
}

Assistant:

StoreOptionAction(Parser& parser_, Option options_[], Option buffer_[],
		int bufmax_) :
		parser(parser_),
		options(options_),
		buffer(buffer_),
		bufmax(bufmax_) {
		// find first empty slot in buffer (if any)
		int bufidx = 0;
		while ((bufmax < 0 || bufidx < bufmax) && buffer[bufidx])
			++bufidx;

		// set parser's optionCount
		parser.op_count = bufidx;
	}